

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall Renderer::UpdateWindowTitle(Renderer *this,int score,int fps)

{
  string title;
  string sStack_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,score);
  std::operator+(&local_d8,"Your Score: [",&local_38);
  std::operator+(&local_b8,&local_d8,"]  highst score = [");
  std::__cxx11::to_string(&local_f8,Mycontroller::highestScore);
  std::operator+(&local_98,&local_b8,&local_f8);
  std::operator+(&local_78,&local_98,"] FPS: ");
  std::__cxx11::to_string(&sStack_118,fps);
  std::operator+(&local_58,&local_78,&sStack_118);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  SDL_SetWindowTitle(this->sdl_window,local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void Renderer::UpdateWindowTitle(int score, int fps) {
  std::string title{"Your Score: [" + std::to_string(score) + "]  highst score = ["+ std::to_string(Mycontroller::highestScore) + "] FPS: " + std::to_string(fps)};
  SDL_SetWindowTitle(sdl_window, title.c_str());
}